

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

int wabt::anon_unknown_0::GetShiftMask(Type type)

{
  int iVar1;
  
  if (type.enum_ == I32) {
    iVar1 = 0x1f;
  }
  else {
    if (type.enum_ != I64) {
      abort();
    }
    iVar1 = 0x3f;
  }
  return iVar1;
}

Assistant:

int GetShiftMask(Type type) {
  // clang-format off
  switch (type) {
    case Type::I32: return 31;
    case Type::I64: return 63;
    default: WABT_UNREACHABLE; return 0;
  }
  // clang-format on
}